

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void update_search_state_nonrd
               (InterModeSearchStateNonrd *search_state,MB_MODE_INFO *mi,TxfmSearchInfo *txfm_info,
               RD_STATS *nonskip_rdc,PICK_MODE_CONTEXT *ctx,PREDICTION_MODE this_best_mode,
               int64_t sse_y)

{
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  undefined1 in_R9B;
  undefined8 in_stack_00000008;
  BEST_PICKMODE *best_pickmode;
  undefined1 local_39;
  
  *(undefined8 *)(in_RDI + 0x78) = in_stack_00000008;
  *(undefined1 *)(in_RDI + 8) = in_R9B;
  *(undefined1 *)(in_RDI + 0x14) = *(undefined1 *)(in_RSI + 0x18);
  memcpy((void *)(in_RDI + 0x18),(void *)(in_RSI + 0x1c),0x24);
  *(uint *)(in_RDI + 0x3c) = (uint)*(byte *)(in_RSI + 0x19);
  *(undefined4 *)(in_RDI + 0x10) = *(undefined4 *)(in_RSI + 0x14);
  *(undefined1 *)(in_RDI + 9) = *(undefined1 *)(in_RSI + 0x91);
  *(undefined1 *)(in_RDI + 0xb) = *(undefined1 *)(in_RSI + 0x10);
  *(undefined1 *)(in_RDI + 0xc) = *(undefined1 *)(in_RSI + 0x11);
  *(undefined1 *)(in_RDI + 0xd) = *(undefined1 *)(in_RDI + 0xa0);
  local_39 = false;
  if (*in_RCX == 0x7fffffff) {
    local_39 = *(char *)(in_RDI + 0xa0) != '\0';
  }
  *(bool *)(in_RDI + 0xe) = local_39;
  if (*(char *)(in_RDI + 0xd) == '\0') {
    memcpy(*(void **)(in_R8 + 0x118),(void *)(in_RDX + 1),(long)*(int *)(in_R8 + 0x1a0));
  }
  return;
}

Assistant:

static inline void update_search_state_nonrd(
    InterModeSearchStateNonrd *search_state, MB_MODE_INFO *const mi,
    TxfmSearchInfo *txfm_info, RD_STATS *nonskip_rdc, PICK_MODE_CONTEXT *ctx,
    PREDICTION_MODE this_best_mode, const int64_t sse_y) {
  BEST_PICKMODE *const best_pickmode = &search_state->best_pickmode;

  best_pickmode->best_sse = sse_y;
  best_pickmode->best_mode = this_best_mode;
  best_pickmode->best_motion_mode = mi->motion_mode;
  best_pickmode->wm_params = mi->wm_params;
  best_pickmode->num_proj_ref = mi->num_proj_ref;
  best_pickmode->best_pred_filter = mi->interp_filters;
  best_pickmode->best_tx_size = mi->tx_size;
  best_pickmode->best_ref_frame = mi->ref_frame[0];
  best_pickmode->best_second_ref_frame = mi->ref_frame[1];
  best_pickmode->best_mode_skip_txfm = search_state->this_rdc.skip_txfm;
  best_pickmode->best_mode_initial_skip_flag =
      (nonskip_rdc->rate == INT_MAX && search_state->this_rdc.skip_txfm);
  if (!best_pickmode->best_mode_skip_txfm) {
    memcpy(ctx->blk_skip, txfm_info->blk_skip,
           sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
  }
}